

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intgemm.cc
# Opt level: O3

CPUType intgemm::anon_unknown_15::EnvironmentCPUID(void)

{
  int iVar1;
  char *__s1;
  CPUType CVar2;
  
  __s1 = getenv("INTGEMM_CPUID");
  CVar2 = AVX512VNNI;
  if (__s1 != (char *)0x0) {
    iVar1 = strcmp(__s1,"AVX512VNNI");
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,"AVX512BW");
      if (iVar1 == 0) {
        CVar2 = AVX512BW;
      }
      else {
        iVar1 = strcmp(__s1,"AVX2");
        if (iVar1 == 0) {
          CVar2 = AVX2;
        }
        else {
          iVar1 = strcmp(__s1,"SSSE3");
          if (iVar1 == 0) {
            CVar2 = SSSE3;
          }
          else {
            iVar1 = strcmp(__s1,"SSE2");
            CVar2 = SSE2;
            if (iVar1 != 0) {
              fprintf(_stderr,"Ignoring unrecognized INTGEMM_CPUID %s\n",__s1);
              CVar2 = AVX512VNNI;
            }
          }
        }
      }
    }
  }
  return CVar2;
}

Assistant:

CPUType EnvironmentCPUID() {
#  if defined(_MSC_VER)
  char env_override[11];
  size_t len = 0;
  if (getenv_s(&len, env_override, sizeof(env_override), "INTGEMM_CPUID")) return CPUType::AVX512VNNI;
  if (!len) return CPUType::AVX512VNNI;
#  else
  const char *env_override = getenv("INTGEMM_CPUID");
  if (!env_override) return CPUType::AVX512VNNI; /* This will be capped to actual ID */
#  endif
  if (!strcmp(env_override, "AVX512VNNI")) return CPUType::AVX512VNNI;
  if (!strcmp(env_override, "AVX512BW")) return CPUType::AVX512BW;
  if (!strcmp(env_override, "AVX2")) return CPUType::AVX2;
  if (!strcmp(env_override, "SSSE3")) return CPUType::SSSE3;
  if (!strcmp(env_override, "SSE2")) return CPUType::SSE2;
  fprintf(stderr, "Ignoring unrecognized INTGEMM_CPUID %s\n", env_override);
  return CPUType::AVX512VNNI;
}